

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O3

void __thiscall TileSwitch::~TileSwitch(TileSwitch *this)

{
  Board *pBVar1;
  iterator iVar2;
  long *plVar3;
  size_t __n;
  long *__dest;
  
  (this->super_Tile)._vptr_Tile = (_func_int **)&PTR__TileSwitch_001d1f88;
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  std::
  _Hashtable<TileSwitch_*,_TileSwitch_*,_std::allocator<TileSwitch_*>,_std::__detail::_Identity,_std::equal_to<TileSwitch_*>,_std::hash<TileSwitch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(pBVar1->switchUpdates)._M_h);
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  iVar2 = std::
          _Hashtable<char,_std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_std::allocator<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(pBVar1->switchKeybinds)._M_h,&(this->super_Tile).field_0x21);
  __dest = *(long **)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                            ._M_cur + 0x10);
  plVar3 = *(long **)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                            ._M_cur + 0x18);
  if (__dest != plVar3) {
    __n = (long)plVar3 - (long)__dest;
    do {
      __n = __n - 8;
      if ((TileSwitch *)*__dest == this) {
        if (__dest + 1 != plVar3) {
          memmove(__dest,__dest + 1,__n);
          plVar3 = *(long **)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                                    ._M_cur + 0x18);
        }
        *(long **)((long)iVar2.
                         super__Node_iterator_base<std::pair<const_char,_std::vector<TileSwitch_*,_std::allocator<TileSwitch_*>_>_>,_false>
                         ._M_cur + 0x18) = plVar3 + -1;
        break;
      }
      __dest = __dest + 1;
    } while (__dest != plVar3);
  }
  pBVar1 = Tile::getBoardPtr(&this->super_Tile);
  std::
  _Hashtable<Tile_*,_std::pair<Tile_*const,_sf::Text>,_std::allocator<std::pair<Tile_*const,_sf::Text>_>,_std::__detail::_Select1st,_std::equal_to<Tile_*>,_std::hash<Tile_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&(pBVar1->tileLabels)._M_h);
  Tile::~Tile(&this->super_Tile);
  return;
}

Assistant:

TileSwitch::~TileSwitch() {
    getBoardPtr()->switchUpdates.erase(this);
    auto mapIter = getBoardPtr()->switchKeybinds.find(_charID);
    for (auto vectorIter = mapIter->second.begin(); vectorIter != mapIter->second.end(); ++vectorIter) {
        if (*vectorIter == this) {
            mapIter->second.erase(vectorIter);
            break;
        }
    }
    getBoardPtr()->tileLabels.erase(this);
}